

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.h
# Opt level: O2

void __thiscall gui::TextBoxStyle::TextBoxStyle(TextBoxStyle *this,TextBoxStyle *param_1)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Color CVar4;
  Color CVar5;
  Color CVar6;
  Color CVar7;
  
  (this->super_Style).gui_ = (param_1->super_Style).gui_;
  (this->super_Style)._vptr_Style = (_func_int **)&PTR__TextBoxStyle_001dc940;
  sf::RectangleShape::RectangleShape(&this->box_,&param_1->box_);
  sf::RectangleShape::RectangleShape(&this->caret_,&param_1->caret_);
  sf::Text::Text(&this->text_,&param_1->text_);
  CVar4 = param_1->boxColor_;
  CVar5 = param_1->readOnlyBoxColor_;
  CVar6 = param_1->textColor_;
  CVar7 = param_1->defaultTextColor_;
  fVar1 = (param_1->textPadding_).x;
  fVar2 = (param_1->textPadding_).y;
  fVar3 = (param_1->textPadding_).z;
  this->defaultTextColor_ = param_1->defaultTextColor_;
  (this->textPadding_).x = fVar1;
  (this->textPadding_).y = fVar2;
  (this->textPadding_).z = fVar3;
  this->boxColor_ = CVar4;
  this->readOnlyBoxColor_ = CVar5;
  this->textColor_ = CVar6;
  this->defaultTextColor_ = CVar7;
  return;
}

Assistant:

virtual ~TextBoxStyle() = default;